

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterEdgeCase::iterate
          (InvariantOuterEdgeCase *this)

{
  float fVar1;
  float fVar2;
  TessPrimitiveType TVar3;
  SpacingMode SVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  RenderContext *pRVar6;
  pointer pfVar7;
  pointer pfVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  long lVar15;
  ulong uVar16;
  deUint32 tfPrimTypeGL;
  long lVar17;
  long lVar18;
  float *__result;
  float *pfVar19;
  pointer this_00;
  ulong uVar20;
  long lVar21;
  _Link_type __last1;
  _anonymous_namespace_ *p_Var22;
  _anonymous_namespace_ *p_Var23;
  VertexArrayBinding *bindings_00;
  _anonymous_namespace_ *p_Var24;
  int iVar25;
  int result_1;
  uint uVar26;
  pointer pPVar27;
  undefined1 innerLevels [8];
  bool bVar28;
  int result;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  Vec3Set outerEdgeVertices;
  Result tfResult;
  RandomViewport viewport;
  Vec3Set firstOuterEdgeVertices;
  VertexArrayBinding bindings [1];
  TFHandler tfHandler;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Random rnd;
  int local_6dc;
  string local_6a8;
  string local_688;
  vector<float,_std::allocator<float>_> local_668;
  long local_650;
  long local_648;
  long local_640;
  long local_638;
  long local_630;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  local_628;
  undefined1 local_610 [40];
  size_t local_5e8;
  Result local_5e0;
  RandomViewport local_5c0;
  set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_5b0;
  string local_580;
  long local_560;
  undefined1 local_558 [8];
  _Alloc_hider local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  int local_530;
  VertexArrayPointer local_528;
  TransformFeedbackHandler<tcu::Vector<float,_3>_> local_500;
  undefined1 local_4b0 [8];
  undefined1 local_4a8 [16];
  _func_int *local_498 [2];
  int local_488;
  ios_base local_438 [264];
  undefined1 local_330 [8];
  _func_int **local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar6 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar11 = (*pRVar6->_vptr_RenderContext[4])(pRVar6);
  dVar12 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_5c0,(RenderTarget *)CONCAT44(extraout_var,iVar11),0x10,0x10,dVar12);
  iVar11 = (*pRVar6->_vptr_RenderContext[3])(pRVar6);
  lVar15 = CONCAT44(extraout_var_00,iVar11);
  outerEdgeDescriptions(&local_628,this->m_primitiveType);
  lVar17 = 4;
  pfVar19 = iterate::singleOuterEdgeLevels;
  do {
    if (*pfVar19 <= *(float *)((long)iterate::singleOuterEdgeLevels + lVar17) &&
        *(float *)((long)iterate::singleOuterEdgeLevels + lVar17) != *pfVar19) {
      pfVar19 = (float *)((long)iterate::singleOuterEdgeLevels + lVar17);
    }
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x30);
  fVar1 = *pfVar19;
  deRandom_init((deRandom *)local_330,0x7b);
  iVar11 = 0;
  generateRandomPatchTessLevels
            ((vector<float,_std::allocator<float>_> *)local_4b0,10,0,fVar1,(Random *)local_330);
  iVar14 = 0;
  do {
    TVar3 = this->m_primitiveType;
    SVar4 = this->m_spacing;
    iVar25 = 0;
    lVar17 = 10;
    innerLevels = local_4b0;
    do {
      iVar13 = referenceVertexCount
                         (TVar3,SVar4,iVar14 != 0,(float *)innerLevels,
                          (float *)((long)innerLevels + 8));
      iVar25 = iVar25 + iVar13;
      innerLevels = (undefined1  [8])((long)innerLevels + 0x18);
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    if (iVar11 <= iVar25) {
      iVar11 = iVar25;
    }
    bVar28 = iVar14 == 0;
    iVar14 = iVar14 + 1;
  } while (bVar28);
  if (local_4b0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4b0,local_4a8._8_8_ - (long)local_4b0);
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&local_500,((this->super_TestCase).m_context)->m_renderCtx,iVar11);
  (**(code **)(lVar15 + 0x1a00))(local_5c0.x,local_5c0.y,local_5c0.width,local_5c0.height);
  (**(code **)(lVar15 + 0xfd8))(0x8e72);
  if ((int)((ulong)((long)local_628.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_628.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
    glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tfPrimQuery.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tfBuffer.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tf.super_ObjectWrapper);
  }
  else {
    lVar17 = 8;
    lVar21 = 0;
    do {
      this_00 = local_628.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar21;
      local_648 = (long)(local_628.
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start)->constantCoordinateValueChoices
                  + lVar17 + -4;
      lVar18 = 0;
      local_650 = lVar21;
      local_638 = lVar17;
      do {
        fVar1 = iterate::singleOuterEdgeLevels[lVar18];
        local_560 = lVar18;
        deRandom_init((deRandom *)local_4b0,0x7b);
        generateRandomPatchTessLevels(&local_668,10,(int)local_650,fVar1,(Random *)local_4b0);
        local_330 = (undefined1  [8])local_320;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"in_v_attr","");
        pfVar8 = local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pfVar7 = local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_4b0._0_4_ = 1;
        local_4a8._0_8_ = local_498;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4a8,local_330,(pointer)((long)local_328 + (long)local_330));
        local_488 = 0;
        local_558._0_4_ = local_4b0._0_4_;
        local_550._M_p = (pointer)&local_540;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_550,local_4a8._0_8_,local_4a8._8_8_ + local_4a8._0_8_);
        local_530 = local_488;
        local_528.componentType = VTX_COMP_FLOAT;
        local_528.convert = VTX_COMP_CONVERT_NONE;
        local_528.numComponents = 1;
        local_528.numElements = (int)((ulong)((long)pfVar8 - (long)pfVar7) >> 2);
        local_528.stride = 0;
        local_528.data = pfVar7;
        if ((_func_int **)local_4a8._0_8_ != local_498) {
          operator_delete((void *)local_4a8._0_8_,(ulong)(local_498[0] + 1));
        }
        if (local_330 != (undefined1  [8])local_320) {
          operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
        }
        local_5b0._M_t._M_impl._0_1_ = (Functional)0x0;
        local_5b0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_5b0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_5b0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_5b0._M_t._M_impl.super__Rb_tree_header._M_header;
        local_5b0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_5b0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_5b0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_4b0 = (undefined1  [8])paVar5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8,"Testing with outer tessellation level ",0x26);
        std::ostream::_M_insert<double>((double)fVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8," for the ",9);
        Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                  ((string *)local_330,this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8,(char *)local_330,(long)local_328);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8,
                   " edge, and with various levels for other edges, and with all programs",0x45);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_330 != (undefined1  [8])local_320) {
          operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
        }
        __last1 = (_Link_type)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
        std::ios_base::~ios_base(local_438);
        pPVar27 = (this->m_programs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)(this->m_programs).
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar27) >> 3
                     ) * -0x55555555) {
          lVar17 = 0;
          do {
            dVar12 = ((pPVar27[lVar17].program.m_ptr)->m_program).m_program;
            local_630 = lVar17;
            (**(code **)(lVar15 + 0x1680))(dVar12);
            pPVar27 = pPVar27 + lVar17;
            tfPrimTypeGL = 0;
            if (pPVar27->usePointMode == false) {
              tfPrimTypeGL = 0xffffffff;
              if ((ulong)this->m_primitiveType < 3) {
                tfPrimTypeGL = *(deUint32 *)(&DAT_01c7c8e0 + (ulong)this->m_primitiveType * 4);
              }
            }
            bindings_00 = (VertexArrayBinding *)local_558;
            TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                      (&local_5e0,&local_500,dVar12,tfPrimTypeGL,1,bindings_00,
                       (int)((ulong)((long)local_668.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish -
                                    (long)local_668.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2));
            TVar3 = this->m_primitiveType;
            SVar4 = this->m_spacing;
            bVar28 = pPVar27->usePointMode;
            iVar11 = 0;
            lVar17 = 10;
            p_Var24 = (_anonymous_namespace_ *)
                      local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              p_Var22 = p_Var24 + 8;
              p_Var23 = p_Var24;
              iVar14 = referenceVertexCount(TVar3,SVar4,bVar28,(float *)p_Var24,(float *)p_Var22);
              iVar13 = (int)p_Var22;
              iVar25 = (int)p_Var23;
              iVar11 = iVar11 + iVar14;
              p_Var24 = p_Var24 + 0x18;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
            if (iVar11 == (int)((ulong)((long)local_5e0.varying.
                                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_5e0.varying.
                                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                          -0x55555555) {
              lVar21 = 0;
              local_6dc = 0;
              lVar17 = local_648;
              do {
                p_Var24 = (_anonymous_namespace_ *)
                          ((long)local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar21 * 0x18);
                p_Var23 = (_anonymous_namespace_ *)
                          ((long)local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar21 * 0x18 + 8);
                p_Var22 = p_Var23;
                iVar11 = referenceVertexCount
                                   (this->m_primitiveType,this->m_spacing,pPVar27->usePointMode,
                                    (float *)p_Var24,(float *)p_Var23);
                iVar25 = (int)p_Var22;
                local_610[0] = (Functional)0x0;
                local_610._8_4_ = _S_red;
                lVar18 = 0;
                iVar14 = 0;
                local_610._16_8_ = (_Base_ptr)0x0;
                local_610._24_8_ = local_610 + 8;
                local_5e8 = 0;
                iVar11 = iVar11 + local_6dc;
                local_640 = lVar21;
                local_610._32_8_ = local_610._24_8_;
                if (local_6dc < iVar11) {
                  lVar21 = (long)local_6dc;
                  do {
                    uVar16 = (ulong)this_00->numConstantCoordinateValueChoices;
                    lVar18 = CONCAT71((int7)((ulong)lVar18 >> 8),0 < (long)uVar16);
                    if ((long)uVar16 < 1) {
LAB_0143d832:
                      if ((char)lVar18 != '\0') goto LAB_0143d836;
                    }
                    else {
                      lVar18 = (long)this_00->constantCoordinateIndex;
                      fVar2 = local_5e0.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar21].m_data[lVar18];
                      if ((fVar2 != this_00->constantCoordinateValueChoices[0]) ||
                         (NAN(fVar2) || NAN(this_00->constantCoordinateValueChoices[0]))) {
                        uVar9 = 1;
                        do {
                          uVar20 = uVar9;
                          if (uVar16 == uVar20) break;
                          pfVar19 = (float *)(lVar17 + -4 + uVar20 * 4);
                          uVar9 = uVar20 + 1;
                        } while ((fVar2 != *pfVar19) || (NAN(fVar2) || NAN(*pfVar19)));
                        lVar18 = CONCAT71((int7)(uVar20 >> 8),uVar20 < uVar16);
                        goto LAB_0143d832;
                      }
LAB_0143d836:
                      std::
                      set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ::insert((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)local_610,
                               local_5e0.varying.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21);
                    }
                    iVar25 = (int)p_Var22;
                    iVar14 = (int)lVar18;
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != iVar11);
                }
                iVar13 = getClampedRoundedTessLevel(this->m_spacing,fVar1);
                lVar21 = local_640;
                if (iVar13 + 1 == (int)local_5e8) {
                  if ((int)local_640 == 0 && (int)local_630 == 0) {
                    bVar28 = true;
                    __last1 = (_Link_type)local_610;
                    std::
                    set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ::operator=(&local_5b0,
                                (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 *)__last1);
                  }
                  else {
                    if (local_5b0._M_t._M_impl.super__Rb_tree_header._M_node_count == local_5e8) {
                      __last1 = (_Link_type)&local_5b0._M_t._M_impl.super__Rb_tree_header;
                      bVar10 = std::__equal<false>::
                               equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                                         ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                          local_5b0._M_t._M_impl.super__Rb_tree_header._M_header.
                                          _M_left,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                                  __last1,
                                          (_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                          local_610._24_8_);
                      bVar28 = true;
                      if (bVar10) goto LAB_0143ded2;
                    }
                    local_4b0 = (undefined1  [8])paVar5;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,
                               "Failure: vertices generated for the edge differ between the following cases:\n"
                               ,0x4d);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,"  - case A: ",0xc);
                    Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program::
                    description_abi_cxx11_
                              ((string *)local_330,
                               (this->m_programs).
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,(char *)local_330,(long)local_328);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,", tessellation levels: ",0x17);
                    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                              ((string *)local_1b0,
                               (_anonymous_namespace_ *)
                               local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start,(float *)0x2,
                               (int)local_668.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 8,
                               (float *)&DAT_00000004,(int)bindings_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,(char *)local_1b0,(long)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,"  - case B: ",0xc);
                    Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program::
                    description_abi_cxx11_(&local_688,pPVar27);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,local_688._M_dataplus._M_p,
                               local_688._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,", tessellation levels: ",0x17);
                    iVar14 = 4;
                    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                              (&local_6a8,p_Var24,(float *)0x2,(int)p_Var23,(float *)&DAT_00000004,
                               (int)bindings_00);
                    iVar11 = (int)p_Var23;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,local_6a8._M_dataplus._M_p,
                               local_6a8._M_string_length);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_4b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
                      operator_delete(local_6a8._M_dataplus._M_p,
                                      local_6a8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_688._M_dataplus._M_p != &local_688.field_2) {
                      operator_delete(local_688._M_dataplus._M_p,
                                      local_688.field_2._M_allocated_capacity + 1);
                    }
                    if (local_1b0 != (undefined1  [8])local_1a0) {
                      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
                    }
                    if (local_330 != (undefined1  [8])local_320) {
                      operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
                    std::ios_base::~ios_base(local_438);
                    local_4b0 = (undefined1  [8])paVar5;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,
                               "Note: resulting vertices for the edge for the cases were:\n",0x3a);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,"  - case A: ",0xc);
                    containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                              ((string *)local_330,(Functional *)&local_5b0,
                               (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)0xe,iVar11,iVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,(char *)local_330,(long)local_328);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,"  - case B: ",0xc);
                    containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                              ((string *)local_1b0,(Functional *)local_610,
                               (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                *)0xe,iVar11,iVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8,(char *)local_1b0,(long)local_1a8);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_4b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if (local_1b0 != (undefined1  [8])local_1a0) {
                      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
                    }
                    lVar21 = local_640;
                    if (local_330 != (undefined1  [8])local_320) {
                      operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
                    std::ios_base::~ios_base(local_438);
                    __last1 = (_Link_type)&DAT_00000001;
                    tcu::TestContext::setTestResult
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                               QP_TEST_RESULT_FAIL,"Invalid set of vertices");
                    bVar28 = false;
                    lVar17 = local_648;
                    iVar11 = local_6dc;
                  }
                }
                else {
                  local_1b0 = (undefined1  [8])paVar5;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,
                             "Failure: the number of vertices on outer edge is ",0x31);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,", expected ",0xb);
                  std::ostream::operator<<((ostringstream *)&local_1a8,iVar13 + 1);
                  local_330 = (undefined1  [8])
                              tcu::MessageBuilder::operator<<
                                        ((MessageBuilder *)local_1b0,
                                         (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_328,"Note: vertices on the outer edge are:\n",0x26);
                  containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                            (&local_688,(Functional *)local_610,
                             (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)0x0,iVar14,iVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_328,local_688._M_dataplus._M_p,
                             local_688._M_string_length);
                  local_4b0 = (undefined1  [8])
                              tcu::MessageBuilder::operator<<
                                        ((MessageBuilder *)local_330,
                                         (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4a8,"Note: the following parameters were used: ",0x2a)
                  ;
                  Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program::
                  description_abi_cxx11_(&local_6a8,pPVar27);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4a8,local_6a8._M_dataplus._M_p,
                             local_6a8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4a8,", tessellation levels: ",0x17);
                  Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                            (&local_580,p_Var24,(float *)0x2,(int)p_Var23,(float *)&DAT_00000004,
                             (int)bindings_00);
                  lVar17 = local_648;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4a8,local_580._M_dataplus._M_p,
                             local_580._M_string_length);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_4b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_580._M_dataplus._M_p != &local_580.field_2) {
                    operator_delete(local_580._M_dataplus._M_p,
                                    local_580.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
                    operator_delete(local_6a8._M_dataplus._M_p,
                                    local_6a8.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
                  std::ios_base::~ios_base(local_438);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_688._M_dataplus._M_p != &local_688.field_2) {
                    operator_delete(local_688._M_dataplus._M_p,
                                    local_688.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
                  std::ios_base::~ios_base(local_2b8);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                  std::ios_base::~ios_base(local_138);
                  __last1 = (_Link_type)&DAT_00000001;
                  tcu::TestContext::setTestResult
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                             QP_TEST_RESULT_FAIL,"Invalid set of vertices");
                  bVar28 = false;
                  lVar21 = local_640;
                  iVar11 = local_6dc;
                }
LAB_0143ded2:
                std::
                _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)local_610._16_8_,__last1);
                if (!bVar28) {
                  uVar26 = 1;
                  goto LAB_0143e0c1;
                }
                lVar21 = lVar21 + 1;
                local_6dc = iVar11;
              } while (lVar21 != 10);
              uVar26 = 0;
            }
            else {
              local_330 = (undefined1  [8])paVar5;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_328,
                         "Failure: the number of vertices returned by transform feedback is ",0x42);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_328,", expected ",0xb);
              std::ostream::operator<<((ostringstream *)&local_328,iVar11);
              local_4b0 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_330,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"Note: rendered ",0xf);
              std::ostream::operator<<((ostringstream *)local_4a8,10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,
                         " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                         ,0x7f);
              containerStr<std::vector<float,std::allocator<float>>>
                        ((string *)local_1b0,(Functional *)&local_668,
                         (vector<float,_std::allocator<float>_> *)0x6,iVar25,iVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,(char *)local_1b0,(long)local_1a8);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if (local_1b0 != (undefined1  [8])local_1a0) {
                operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              std::ios_base::~ios_base(local_438);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
              std::ios_base::~ios_base(local_2b8);
              uVar26 = 1;
              __last1 = (_Link_type)&DAT_00000001;
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Invalid set of vertices");
              bVar28 = false;
            }
LAB_0143e0c1:
            if (local_5e0.varying.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              __last1 = (_Link_type)
                        ((long)local_5e0.varying.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5e0.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
              operator_delete(local_5e0.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,(ulong)__last1);
            }
            if (!bVar28) goto LAB_0143e119;
            lVar17 = local_630 + 1;
            pPVar27 = (this->m_programs).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (lVar17 < (int)((ulong)((long)(this->m_programs).
                                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pPVar27) >> 3) * -0x55555555);
        }
        uVar26 = 0xb;
LAB_0143e119:
        std::
        _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    *)local_5b0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__last1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_p != &local_540) {
          operator_delete(local_550._M_p,local_540._M_allocated_capacity + 1);
        }
        if ((_anonymous_namespace_ *)
            local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (_anonymous_namespace_ *)0x0) {
          operator_delete(local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_668.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (uVar26 != 0xb) {
          bVar28 = (uVar26 & 7) == 0;
          goto LAB_0143e18e;
        }
        lVar18 = local_560 + 1;
      } while (lVar18 != 0xc);
      bVar28 = true;
LAB_0143e18e:
      if (!bVar28) {
        glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tfPrimQuery.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tfBuffer.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tf.super_ObjectWrapper);
        goto LAB_0143e25e;
      }
      lVar21 = local_650 + 1;
      lVar17 = local_638 + 0x10;
    } while (lVar21 < (int)((ulong)((long)local_628.
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_628.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
    glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tfPrimQuery.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tfBuffer.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&local_500.m_tf.super_ObjectWrapper);
    if (!bVar28) goto LAB_0143e25e;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_0143e25e:
  if (local_628.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_628.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_628.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_628.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

InvariantOuterEdgeCase::IterateResult InvariantOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const int							numPatchesPerDrawCall		= 10;
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(numPatchesPerDrawCall, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));

			for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
				maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall,
												   multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, usePointModeI != 0, &patchTessLevels[0], numPatchesPerDrawCall));
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(numPatchesPerDrawCall, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };
					Vec3Set							firstOuterEdgeVertices; // Vertices of the outer edge of the first patch of the first program's draw call; used for comparison with other patches.

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges, and with all programs" << TestLog::EndMessage;

					for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
					{
						const Program& program		= m_programs[programNdx];
						const deUint32 programGL	= program.program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult			= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, program.usePointMode),
																											   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices		= multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, &patchTessLevels[0], numPatchesPerDrawCall);
							int							numVerticesRead		= 0;

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered " << numPatchesPerDrawCall
														<< " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices of each patch.

							for (int patchNdx = 0; patchNdx < numPatchesPerDrawCall; patchNdx++)
							{
								const float* const	innerLevels			= &patchTessLevels[6*patchNdx + 0];
								const float* const	outerLevels			= &patchTessLevels[6*patchNdx + 2];
								const int			patchNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, innerLevels, outerLevels);
								Vec3Set				outerEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = numVerticesRead; vtxNdx < numVerticesRead + patchNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx];
									if (edgeDesc.contains(vtx))
										outerEdgeVertices.insert(tfResult.varying[vtxNdx]);
								}

								// Check that the outer edge contains an appropriate number of vertices.
								{
									const int refNumVerticesOnOuterEdge = 1 + getClampedRoundedTessLevel(m_spacing, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

									if ((int)outerEdgeVertices.size() != refNumVerticesOnOuterEdge)
									{
										log << TestLog::Message << "Failure: the number of vertices on outer edge is " << outerEdgeVertices.size()
																<< ", expected " << refNumVerticesOnOuterEdge << TestLog::EndMessage
											<< TestLog::Message << "Note: vertices on the outer edge are:\n" << containerStr(outerEdgeVertices, 5, 0) << TestLog::EndMessage
											<< TestLog::Message << "Note: the following parameters were used: " << program.description()
																<< ", tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								// Compare the vertices to those of the first patch (unless this is the first patch).

								if (programNdx == 0 && patchNdx == 0)
									firstOuterEdgeVertices = outerEdgeVertices;
								else
								{
									if (firstOuterEdgeVertices != outerEdgeVertices)
									{
										log << TestLog::Message << "Failure: vertices generated for the edge differ between the following cases:\n"
																<< "  - case A: " << m_programs[0].description() << ", tessellation levels: "
																				  << tessellationLevelsString(&patchTessLevels[0], &patchTessLevels[2]) << "\n"
																<< "  - case B: " << program.description() << ", tessellation levels: "
																				  << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;

										log << TestLog::Message << "Note: resulting vertices for the edge for the cases were:\n"
																<< "  - case A: " << containerStr(firstOuterEdgeVertices, 5, 14) << "\n"
																<< "  - case B: " << containerStr(outerEdgeVertices, 5, 14) << TestLog::EndMessage;

										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								numVerticesRead += patchNumVertices;
							}

							DE_ASSERT(numVerticesRead == (int)tfResult.varying.size());
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}